

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::CLOSURE_OP(SQVM *this,SQObjectPtr *target,SQFunctionProto *func)

{
  SQOuterType SVar1;
  long lVar2;
  SQFunctionProto *in_RDX;
  SQObjectPtr *in_RSI;
  SQClosure *in_RDI;
  SQVM *unaff_retaddr;
  SQInteger spos;
  SQInteger i_1;
  SQInteger ndefparams;
  SQOuterVar *v;
  SQInteger i;
  SQClosure *closure;
  SQInteger nouters;
  SQObjectType in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  SQWeakRef *root;
  SQFunctionProto *func_00;
  SQSharedState *in_stack_ffffffffffffffb0;
  long local_48;
  long local_30;
  SQClosure *target_00;
  
  root = (SQWeakRef *)in_RDI[2]._defaultparams;
  func_00 = in_RDX;
  target_00 = in_RDI;
  SQRefCounted::GetWeakRef
            ((SQRefCounted *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff8c);
  SQClosure::Create(in_stack_ffffffffffffffb0,func_00,root);
  lVar2 = in_RDX->_noutervalues;
  if (lVar2 != 0) {
    for (local_30 = 0; local_30 < lVar2; local_30 = local_30 + 1) {
      SVar1 = in_RDX->_outervalues[local_30]._type;
      if (SVar1 == otLOCAL) {
        FindOuter(unaff_retaddr,(SQObjectPtr *)target_00,in_RSI);
      }
      else if (SVar1 == otOUTER) {
        ::SQObjectPtr::operator=((SQObjectPtr *)root,(SQObjectPtr *)in_RDI);
      }
    }
  }
  lVar2 = in_RDX->_ndefaultparams;
  if (lVar2 != 0) {
    for (local_48 = 0; local_48 < lVar2; local_48 = local_48 + 1) {
      ::SQObjectPtr::operator=((SQObjectPtr *)root,(SQObjectPtr *)in_RDI);
    }
  }
  ::SQObjectPtr::operator=((SQObjectPtr *)root,in_RDI);
  return true;
}

Assistant:

bool SQVM::CLOSURE_OP(SQObjectPtr &target, SQFunctionProto *func)
{
    SQInteger nouters;
    SQClosure *closure = SQClosure::Create(_ss(this), func,_table(_roottable)->GetWeakRef(OT_TABLE));
    if((nouters = func->_noutervalues)) {
        for(SQInteger i = 0; i<nouters; i++) {
            SQOuterVar &v = func->_outervalues[i];
            switch(v._type){
            case otLOCAL:
                FindOuter(closure->_outervalues[i], &STK(_integer(v._src)));
                break;
            case otOUTER:
                closure->_outervalues[i] = _closure(ci->_closure)->_outervalues[_integer(v._src)];
                break;
            }
        }
    }
    SQInteger ndefparams;
    if((ndefparams = func->_ndefaultparams)) {
        for(SQInteger i = 0; i < ndefparams; i++) {
            SQInteger spos = func->_defaultparams[i];
            closure->_defaultparams[i] = _stack._vals[_stackbase + spos];
        }
    }
    target = closure;
    return true;

}